

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highbd_fwd_txfm_avx2.c
# Opt level: O2

void av1_fwd_txfm2d_8x16_avx2(int16_t *input,int32_t *coeff,int stride,TX_TYPE tx_type,int bd)

{
  char cVar1;
  code *pcVar2;
  code *pcVar3;
  uint uVar4;
  int8_t *piVar5;
  undefined7 in_register_00000009;
  int16_t *input_00;
  int flipud;
  int iVar6;
  int iVar7;
  __m256i in [16];
  __m256i out [16];
  int16_t *local_488;
  longlong local_460 [4];
  longlong local_440 [28];
  longlong local_360 [32];
  longlong local_260 [32];
  longlong alStack_160 [38];
  
  piVar5 = av1_fwd_txfm_shift_ls[7];
  uVar4 = (uint)CONCAT71(in_register_00000009,tx_type);
  pcVar2 = *(code **)((long)col_highbd_txfm8x16_arr + (ulong)(uVar4 * 8));
  pcVar3 = *(code **)((long)row_highbd_txfm8x8_arr + (ulong)(uVar4 * 8));
  iVar6 = 0;
  if (uVar4 < 0x10) {
    flipud = 1;
    iVar7 = 0;
    if ((0x4110U >> (uVar4 & 0x1f) & 1) != 0) {
LAB_00a05483:
      input_00 = input + stride * 8;
      local_488 = input;
      goto LAB_00a0549c;
    }
    if ((0x80a0U >> (uVar4 & 0x1f) & 1) == 0) {
      iVar7 = flipud;
      if (uVar4 == 6) goto LAB_00a05483;
    }
    else {
      iVar6 = 1;
    }
  }
  iVar7 = iVar6;
  local_488 = input + stride * 8;
  input_00 = input;
  flipud = 0;
LAB_00a0549c:
  cVar1 = *av1_fwd_txfm_shift_ls[7];
  load_buffer_8x8_avx2(input_00,&local_460,stride,flipud,iVar7,(int)cVar1);
  load_buffer_8x8_avx2(local_488,(__m256i *)local_360,stride,flipud,iVar7,(int)cVar1);
  (*pcVar2)(local_460,(__m256i *)local_260,0xd,1,1);
  iVar6 = -(int)piVar5[1];
  col_txfm_8x8_rounding((__m256i *)local_260,iVar6);
  col_txfm_8x8_rounding((__m256i *)alStack_160,iVar6);
  iVar7 = 2;
  fwd_txfm_transpose_8x8_avx2((__m256i *)local_260,&local_460,1,2);
  fwd_txfm_transpose_8x8_avx2((__m256i *)alStack_160,(__m256i *)local_440,1,2);
  iVar6 = iVar7;
  (*pcVar3)(&local_460,(__m256i *)local_260,0xd);
  round_shift_rect_array_32_avx2((__m256i *)local_260,&local_460,-(int)piVar5[2],iVar6,iVar7);
  store_buffer_avx2(&local_460,coeff,0x10,iVar6);
  return;
}

Assistant:

void av1_fwd_txfm2d_8x16_avx2(const int16_t *input, int32_t *coeff, int stride,
                              TX_TYPE tx_type, int bd) {
  __m256i in[16], out[16];
  const int8_t *shift = av1_fwd_txfm_shift_ls[TX_8X16];
  const int txw_idx = get_txw_idx(TX_8X16);
  const int txh_idx = get_txh_idx(TX_8X16);
  const transform_1d_avx2 col_txfm = col_highbd_txfm8x16_arr[tx_type];
  const transform_1d_avx2 row_txfm = row_highbd_txfm8x8_arr[tx_type];
  const int8_t bit = av1_fwd_cos_bit_col[txw_idx][txh_idx];
  int ud_flip, lr_flip;
  get_flip_cfg(tx_type, &ud_flip, &lr_flip);

  load_buffer_8x16_avx2(input, in, stride, ud_flip, lr_flip, shift[0]);
  col_txfm(in, out, bit, 1, 1);
  col_txfm_8x8_rounding(out, -shift[1]);
  col_txfm_8x8_rounding(&out[8], -shift[1]);
  fwd_txfm_transpose_8x8_avx2(out, in, 1, 2);
  fwd_txfm_transpose_8x8_avx2(&out[8], &in[1], 1, 2);
  row_txfm(in, out, bit, 2, 2);
  round_shift_rect_array_32_avx2(out, in, 16, -shift[2], NewSqrt2);
  store_buffer_avx2(in, coeff, 8, 16);
  (void)bd;
}